

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoTriangle> *this,TPZGeoBlend<pzgeom::TPZGeoTriangle> *cp)

{
  int64_t iVar1;
  long lVar2;
  TPZTransform<double> *t;
  TPZTransform<double> *this_00;
  
  (this->super_TPZGeoTriangle).super_TPZNodeRep<3,_pztopology::TPZTriangle>.super_TPZTriangle.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_016c7f50;
  iVar1 = (cp->super_TPZGeoTriangle).super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[1];
  (this->super_TPZGeoTriangle).super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[0] =
       (cp->super_TPZGeoTriangle).super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[0];
  (this->super_TPZGeoTriangle).super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[1] = iVar1;
  (this->super_TPZGeoTriangle).super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[2] =
       (cp->super_TPZGeoTriangle).super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[2];
  (this->super_TPZGeoTriangle).super_TPZNodeRep<3,_pztopology::TPZTriangle>.super_TPZTriangle.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_016c3fd0;
  lVar2 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar2) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) = 0xffffffffffffffff;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x78);
  this_00 = (TPZTransform<double> *)&this->field_0xa0;
  lVar2 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)((long)this_00 + lVar2));
    lVar2 = lVar2 + 0x1a0;
  } while (lVar2 != 0x820);
  t = (TPZTransform<double> *)&cp->field_0xa0;
  for (lVar2 = 0; lVar2 != 0x78; lVar2 = lVar2 + 0x18) {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) =
         *(undefined8 *)((long)&cp->fNeighbours[0].fGeoElIndex + lVar2);
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) =
         *(undefined4 *)((long)&cp->fNeighbours[0].fSide + lVar2);
    TPZTransform<double>::operator=(this_00,t);
    t = t + 1;
    this_00 = this_00 + 1;
  }
  this->fGeoEl = (TPZGeoEl *)0x0;
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.h",
             0x3f);
}

Assistant:

TPZGeoBlend(const TPZGeoBlend &cp) : TPZRegisterClassId(&TPZGeoBlend::ClassId), TGeo(cp) {
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fNeighbours[is] =  cp.fNeighbours[is];
                fTrans[is] =  cp.fTrans[is];
            }
            fGeoEl = 0;
            DebugStop();
        }